

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl
          (MessageGenerator *this,Printer *p)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  FieldGeneratorTable *this_01;
  pointer ppFVar1;
  FieldDescriptor *pFVar2;
  ushort *puVar3;
  AnyInvocable<void_()> emit_body;
  undefined1 auVar4 [32];
  Printer *pPVar5;
  pointer end;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  HasbitMode HVar9;
  int iVar10;
  int iVar11;
  uint32_t n;
  ChunkIterator end_00;
  Nullable<const_char_*> pcVar12;
  FieldGenerator *this_02;
  char *pcVar13;
  int __c;
  vector<int,_std::allocator<int>_> *extraout_RDX;
  vector<int,_std::allocator<int>_> *extraout_RDX_00;
  vector<int,_std::allocator<int>_> *extraout_RDX_01;
  vector<int,_std::allocator<int>_> *has_bit_indices;
  FieldDescriptor *pFVar14;
  lts_20250127 *this_03;
  Options *options;
  pointer ppFVar15;
  Options *pOVar16;
  ChunkIterator start;
  long lVar17;
  string_view prefix;
  string_view prefix_00;
  string_view s;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  Printer *p_local;
  MessageGenerator *local_4e8;
  undefined1 in_stack_fffffffffffffb20;
  int cached_has_word_index;
  Options *local_4d0;
  allocator<char> local_4c4;
  allocator<char> local_4c3;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  Formatter format;
  value_type oneof;
  vector<int,_std::allocator<int>_> *local_488;
  int local_47c;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined7 uStack_427;
  undefined8 uStack_420;
  Iterator __begin3;
  undefined1 local_3f8 [48];
  _Alloc_hider local_3c8;
  code *local_3c0;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  string local_3a0;
  Iterator __end3;
  string local_370;
  string local_350;
  FieldDescriptor *field;
  Sub local_278;
  Sub local_1c0;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8;
  undefined7 uStack_f7;
  undefined8 uStack_f0;
  variant<std::__cxx11::string,std::function<bool()>> local_e8 [32];
  char local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0;
  undefined1 local_58;
  string local_50;
  
  pOVar16 = &this->options_;
  p_local = p;
  local_4e8 = this;
  bVar6 = HasSimpleBaseClass(this->descriptor_,pOVar16);
  if (bVar6) {
    return;
  }
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  format.printer_ = p;
  Formatter::operator()<>
            (&format,
             "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const $pb$::MessageLite& from_msg) {\n$WeakDescriptorSelfPin$  auto* const _this = static_cast<$classname$*>(&to_msg);\n  auto& from = static_cast<const $classname$&>(from_msg);\n"
            );
  (format.printer_)->indent_ =
       (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
  bVar6 = RequiresArena(local_4e8,kMergeFrom);
  if (bVar6) {
    io::Printer::Emit(p_local,0x33,"\n      $pb$::Arena* arena = _this->GetArena();\n    ");
  }
  Formatter::operator()<>
            (&format,
             "$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n"
            );
  Formatter::operator()<>(&format,"$DCHK$_NE(&from, _this);\n");
  Formatter::operator()<>(&format,"$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n");
  bVar6 = ShouldSplit(local_4e8->descriptor_,pOVar16);
  if (bVar6) {
    Formatter::operator()<>
              (&format,
               "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n  _this->PrepareSplitMessageForWrite();\n}\n"
              );
  }
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppFVar1 = (local_4e8->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_4d0 = pOVar16;
  for (ppFVar15 = (local_4e8->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      end = chunks.
            super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
            ._M_impl.super__Vector_impl_data._M_finish, ppFVar15 != ppFVar1; ppFVar15 = ppFVar15 + 1
      ) {
    pFVar2 = *ppFVar15;
    field = pFVar2;
    if (chunks.
        super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        chunks.
        super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001ed3b6:
      bVar6 = protobuf::internal::cpp::HasHasbit(field);
      pOVar16 = local_4d0;
      v.storage_.is_callback_engaged_ = bVar6;
      local_3a0._M_dataplus._M_p._0_1_ = IsRarelyPresent(field,local_4d0);
      bVar6 = ShouldSplit(field,pOVar16);
      __begin3.idx = CONCAT31(__begin3.idx._1_3_,bVar6);
      std::
      vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
      ::emplace_back<bool,bool,bool>
                ((vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
                  *)&chunks,(bool *)&v,(bool *)&local_3a0,(bool *)&__begin3);
    }
    else {
      pFVar14 = chunks.
                super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1];
      iVar10 = HasByteIndex(local_4e8,pFVar14);
      iVar11 = HasByteIndex(local_4e8,pFVar2);
      if (iVar10 != iVar11) goto LAB_001ed3b6;
      bVar6 = IsLikelyPresent(pFVar14,local_4d0);
      bVar7 = IsLikelyPresent(pFVar2,local_4d0);
      if (bVar6 != bVar7) goto LAB_001ed3b6;
      bVar6 = ShouldSplit(pFVar14,local_4d0);
      bVar7 = ShouldSplit(pFVar2,local_4d0);
      if (bVar6 != bVar7) goto LAB_001ed3b6;
    }
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back(&chunks.
                 super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].fields,&field);
  }
  cached_has_word_index = -1;
  local_488 = &local_4e8->has_bit_indices_;
  this_01 = &local_4e8->field_generators_;
  pOVar16 = local_4d0;
  start._M_current =
       chunks.
       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
       ._M_impl.super__Vector_impl_data._M_start;
  while (start._M_current != end) {
    end_00 = FindNextUnequalChunk<bool(google::protobuf::compiler::cpp::FieldChunk_const&,google::protobuf::compiler::cpp::FieldChunk_const&)>
                       (start,(ChunkIterator)end,cpp::anon_unknown_0::MayGroupChunksForHaswordsCheck
                       );
    iVar10 = cached_has_word_index;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&field,"from.",(allocator<char> *)&v);
    options = (Options *)(ulong)(uint)iVar10;
    bVar6 = cpp::anon_unknown_0::MaybeEmitHaswordsCheck
                      (start,end_00,pOVar16,local_488,iVar10,(string *)&field,p_local);
    std::__cxx11::string::~string((string *)&field);
    for (; start._M_current != end_00._M_current; start._M_current = start._M_current + 1) {
      iVar10 = HasByteIndex(local_4e8,
                            *((start._M_current)->fields).
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      if ((iVar10 == -1) ||
         (ppFVar15 = ((start._M_current)->fields).
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
         (ulong)((long)ppFVar15 -
                (long)((start._M_current)->fields).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start) < 9)) {
        bVar7 = false;
      }
      else {
        bVar7 = IsLikelyPresent(ppFVar15[-1],pOVar16);
        bVar7 = !bVar7;
      }
      this_00 = &(start._M_current)->fields;
      cpp::anon_unknown_0::DebugAssertUniformLikelyPresence(this_00,pOVar16);
      iVar11 = cached_has_word_index;
      has_bit_indices = extraout_RDX;
      if ((iVar10 != -1) &&
         (iVar10 = HasWordIndex(local_4e8,
                                *(this_00->
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 )._M_impl.super__Vector_impl_data._M_start),
         has_bit_indices = extraout_RDX_00, iVar11 != iVar10)) {
        cached_has_word_index =
             HasWordIndex(local_4e8,
                          *(this_00->
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           )._M_impl.super__Vector_impl_data._M_start);
        Formatter::operator()
                  (&format,"cached_has_bits = from.$has_bits$[$1$];\n",&cached_has_word_index);
        has_bit_indices = extraout_RDX_01;
      }
      if (bVar7) {
        n = GenChunkMask((cpp *)this_00,
                         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)local_488,has_bit_indices);
        iVar10 = cpp::anon_unknown_0::popcnt(n);
        pcVar12 = absl::lts_20250127::log_internal::Check_LEImpl(2,iVar10,"2 <= popcnt(chunk_mask)")
        ;
        if (pcVar12 != (Nullable<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&field,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                     ,0x10ee,pcVar12);
LAB_001eda57:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&field);
        }
        pcVar12 = absl::lts_20250127::log_internal::Check_GEImpl(8,iVar10,"8 >= popcnt(chunk_mask)")
        ;
        if (pcVar12 != (Nullable<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&field,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                     ,0x10ef,pcVar12);
          goto LAB_001eda57;
        }
        cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbabilityForGroup_abi_cxx11_
                  ((string *)&field,(_anonymous_namespace_ *)(ulong)n,(uint32_t)this_00,
                   (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)pOVar16,options);
        Formatter::operator()(&format,"if ($1$) {\n",(string *)&field);
        std::__cxx11::string::~string((string *)&field);
        (format.printer_)->indent_ =
             (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
      }
      ppFVar1 = ((start._M_current)->fields).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppFVar15 = ((start._M_current)->fields).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; pOVar16 = local_4d0,
          ppFVar15 != ppFVar1; ppFVar15 = ppFVar15 + 1) {
        pFVar2 = *ppFVar15;
        this_02 = FieldGeneratorTable::get(this_01,pFVar2);
        bVar8 = FieldDescriptor::is_repeated(pFVar2);
        if (bVar8) {
          FieldGenerator::GenerateMergingCode(this_02,p_local);
        }
        else {
          bVar8 = FieldDescriptor::is_required(pFVar2);
          if (((bVar8) || (bVar8 = FieldDescriptor::is_repeated(pFVar2), bVar8)) ||
             (bVar8 = protobuf::internal::cpp::HasHasbit(pFVar2), pPVar5 = p_local, bVar8)) {
            iVar10 = cached_has_word_index;
            if (((pFVar2->options_->field_0)._impl_.weak_ == false) &&
               (pFVar14 = pFVar2, iVar11 = HasWordIndex(local_4e8,pFVar2), iVar10 == iVar11)) {
              bVar8 = protobuf::internal::cpp::HasHasbit(pFVar2);
              if (!bVar8) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&field,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                           ,0x1111,"HasHasbit(field)");
                goto LAB_001eda57;
              }
              pcVar13 = FieldDescriptor::index(pFVar2,(char *)pFVar14,__c);
              cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbabilityForField_abi_cxx11_
                        ((string *)&field,
                         (_anonymous_namespace_ *)
                         (ulong)(uint)(local_488->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_start[(int)pcVar13],
                         (int)pFVar2,(FieldDescriptor *)local_4d0,options);
              Formatter::operator()(&format,"if ($1$) {\n",(string *)&field);
              std::__cxx11::string::~string((string *)&field);
              (format.printer_)->indent_ =
                   (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
              HVar9 = protobuf::internal::cpp::GetFieldHasbitMode(pFVar2);
              pPVar5 = p_local;
              if (HVar9 == kHintHasbit) {
                bVar8 = ShouldSplit(pFVar2,local_4d0);
                local_3f8._8_8_ = &p_local;
                local_3f8._24_8_ =
                     absl::lts_20250127::internal_any_invocable::
                     LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1&>
                ;
                local_3f8._16_8_ = absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
                options = (Options *)(ulong)bVar8;
                auVar4._8_8_ = p_local;
                auVar4._0_8_ = uStack_4f8;
                auVar4._16_8_ = local_4e8;
                auVar4._24_8_ = 0;
                prefix._M_str = (char *)pFVar2;
                prefix._M_len = (size_t)"from.";
                local_3f8._0_8_ = this_02;
                cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                          ((anon_unknown_0 *)pPVar5,(Printer *)0x5,prefix,(FieldDescriptor *)options
                           ,SUB81(local_4d0,0),(Options *)local_3f8,
                           (AnyInvocable<void_()>)(auVar4 << 0x40),(bool)in_stack_fffffffffffffb20);
                (*(code *)local_3f8._16_8_)(1,(Options *)local_3f8,(Options *)local_3f8,0);
              }
              else {
                HVar9 = protobuf::internal::cpp::GetFieldHasbitMode(pFVar2);
                if (HVar9 != kTrueHasbit) {
                  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                            ((LogMessageFatal *)&field,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                             ,0x111f,"GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit");
                  goto LAB_001eda57;
                }
                if (((!bVar7) || (bVar8 = FieldDescriptor::is_repeated(pFVar2), bVar8)) ||
                   (((pFVar2->field_0x1 & 8) != 0 ||
                    (7 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar2->type_ * 4) -
                         1U)))) {
                  FieldGenerator::GenerateMergingCode(this_02,p_local);
                }
                else {
                  FieldGenerator::GenerateCopyConstructorCode(this_02,p_local);
                }
              }
              io::Printer::Outdent(format.printer_);
              Formatter::operator()<>(&format,"}\n");
            }
            else {
              pPVar5 = p_local;
              HasBitVars_abi_cxx11_
                        ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&field,local_4e8,pFVar2);
              io::Printer::
              WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
                        (&v,pPVar5,
                         (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&field);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&field);
              Formatter::operator()<>
                        (&format,"if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) {\n");
              (format.printer_)->indent_ =
                   (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
              FieldGenerator::GenerateMergingCode(this_02,p_local);
              io::Printer::Outdent(format.printer_);
              Formatter::operator()<>(&format,"}\n");
              absl::lts_20250127::
              Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1039:28)>
              ::~Cleanup(&v);
            }
          }
          else {
            bVar8 = ShouldSplit(pFVar2,local_4d0);
            local_3f8._40_8_ = &p_local;
            local_3c0 = absl::lts_20250127::internal_any_invocable::
                        LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__0&>
            ;
            local_3c8._M_p =
                 (pointer)absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
            options = (Options *)(ulong)bVar8;
            pOVar16 = (Options *)(local_3f8 + 0x20);
            emit_body.super_Impl<void_()>.super_CoreImpl<false,_void>.state_.remote.size =
                 uStack_4f8;
            emit_body.super_Impl<void_()>.super_CoreImpl<false,_void>.state_.remote.target =
                 (void *)0x1;
            emit_body.super_Impl<void_()>.super_CoreImpl<false,_void>.manager_ =
                 (ManagerType *)p_local;
            emit_body.super_Impl<void_()>.super_CoreImpl<false,_void>.invoker_ =
                 (InvokerType<false,_void> *)local_4e8;
            prefix_00._M_str = (char *)pFVar2;
            prefix_00._M_len = (size_t)"from.";
            local_3f8._32_8_ = this_02;
            cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                      ((anon_unknown_0 *)pPVar5,(Printer *)0x5,prefix_00,(FieldDescriptor *)options,
                       SUB81(local_4d0,0),pOVar16,emit_body,(bool)in_stack_fffffffffffffb20);
            (*(code *)local_3c8._M_p)(1,pOVar16,pOVar16,1);
          }
        }
      }
      if (bVar7) {
        io::Printer::Outdent(format.printer_);
        Formatter::operator()<>(&format,"}\n");
      }
    }
    if (bVar6) {
      io::Printer::Outdent(p_local);
      io::Printer::Emit(p_local,0x11,"\n        }\n      ");
      cached_has_word_index = -1;
    }
  }
  if (local_4e8->max_has_bit_index_ - 1U < 0x20) {
    pcVar13 = "\n      _this->$has_bits$[0] |= cached_has_bits;\n    ";
    uStack_500 = 0x34;
  }
  else {
    if ((uint)((local_4e8->max_has_bit_index_ + 0x1f) / 0x20) < 2) goto LAB_001eda86;
    pcVar13 = "\n      _this->$has_bits$.Or(from.$has_bits$);\n    ";
    uStack_500 = 0x32;
  }
  io::Printer::Emit(p_local,uStack_500,pcVar13);
LAB_001eda86:
  __begin3.descriptor = local_4e8->descriptor_;
  __begin3.idx = 0;
  __end3.idx = (__begin3.descriptor)->real_oneof_decl_count_;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar6 = cpp::operator!=(&__begin3,&__end3);
    if (!bVar6) break;
    oneof = OneOfRangeImpl::Iterator::operator*(&__begin3);
    pPVar5 = p_local;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"name",&local_4c1);
    puVar3 = (ushort *)(oneof->all_names_).payload_;
    local_3b0._M_len = (size_t)*puVar3;
    pcVar13 = (char *)((long)puVar3 + ~local_3b0._M_len);
    local_3b0._M_str = pcVar13;
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              ((Sub *)&field,&local_350,&local_3b0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"NAME",&local_4c2);
    puVar3 = (ushort *)(oneof->all_names_).payload_;
    this_03 = (lts_20250127 *)(ulong)*puVar3;
    s._M_len = (long)puVar3 + ~(ulong)this_03;
    s._M_str = pcVar13;
    absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_3a0,this_03,s);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_278,&local_50,&local_3a0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"index",&local_4c3);
    local_47c = (int)(((long)oneof - (long)oneof->containing_type_->oneof_decls_) / 0x38);
    io::Printer::Sub::Sub<int>(&local_1c0,&local_370,&local_47c);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"cases",&local_4c4);
    local_100 = local_430;
    local_108 = &local_f8;
    if (local_438 == &local_428) {
      uStack_f0 = uStack_420;
    }
    else {
      local_108 = local_438;
    }
    _local_f8 = CONCAT71(uStack_427,local_428);
    local_430 = 0;
    local_428 = 0;
    v.storage_.is_callback_engaged_ = false;
    v.storage_._1_7_ = 0;
    v.storage_.callback_buffer_[0] = '\0';
    v.storage_.callback_buffer_[1] = '\0';
    v.storage_.callback_buffer_[2] = '\0';
    v.storage_.callback_buffer_[3] = '\0';
    v.storage_.callback_buffer_[4] = '\0';
    v.storage_.callback_buffer_[5] = '\0';
    v.storage_.callback_buffer_[6] = '\0';
    v.storage_.callback_buffer_[7] = '\0';
    local_438 = &local_428;
    v.storage_._0_8_ = operator_new(0x20);
    *(value_type **)v.storage_._0_8_ = &oneof;
    *(Printer ***)(v.storage_._0_8_ + 8) = &p_local;
    *(MessageGenerator **)(v.storage_._0_8_ + 0x10) = local_4e8;
    *(undefined1 *)(v.storage_._0_8_ + 0x18) = 0;
    std::variant<std::__cxx11::string,std::function<bool()>>::
    variant<std::function<bool()>,void,void,std::function<bool()>,void>
              (local_e8,(function<bool_()> *)&v);
    std::_Function_base::~_Function_base((_Function_base *)&v);
    local_c0 = local_b0;
    local_b8 = 0;
    local_b0[0] = 0;
    local_a0 = 0;
    if (local_c8 == '\x01') {
      std::__cxx11::string::assign((char *)&local_c0);
    }
    local_58 = 0;
    io::Printer::Emit(pPVar5,&field,4,0x28d,
                      "\n              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {\n                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];\n                const bool oneof_needs_init = oneof_to_case != oneof_from_case;\n                if (oneof_needs_init) {\n                  if (oneof_to_case != 0) {\n                    _this->clear_$name$();\n                  }\n                  _this->$oneof_case$[$index$] = oneof_from_case;\n                }\n\n                switch (oneof_from_case) {\n                  $cases$;\n                  case $NAME$_NOT_SET:\n                    break;\n                }\n              }\n            "
                     );
    lVar17 = 0x228;
    do {
      io::Printer::Sub::~Sub((Sub *)((long)&field + lVar17));
      lVar17 = lVar17 + -0xb8;
    } while (lVar17 != -0xb8);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_350);
    __begin3.idx = __begin3.idx + 1;
  }
  if (local_4e8->num_weak_fields_ != 0) {
    Formatter::operator()<>(&format,"_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);\n");
  }
  if (0 < local_4e8->descriptor_->extension_range_count_) {
    io::Printer::Emit(p_local,0x52,
                      "\n      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);\n    "
                     );
  }
  Formatter::operator()<>
            (&format,
             "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n"
            );
  io::Printer::Outdent(format.printer_);
  Formatter::operator()<>(&format,"}\n");
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::~vector(&chunks);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&format.vars_);
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeImpl(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the ABSL_CHECK and
  // cast.
  Formatter format(p);
  format(
      "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const "
      "$pb$::MessageLite& from_msg) {\n"
      "$WeakDescriptorSelfPin$"
      "  auto* const _this = static_cast<$classname$*>(&to_msg);\n"
      "  auto& from = static_cast<const $classname$&>(from_msg);\n");
  format.Indent();
  if (RequiresArena(GeneratorFunction::kMergeFrom)) {
    p->Emit(R"cc(
      $pb$::Arena* arena = _this->GetArena();
    )cc");
  }
  format(
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n");
  format("$DCHK$_NE(&from, _this);\n");

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  if (ShouldSplit(descriptor_, options_)) {
    format(
        "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n"
        "  _this->PrepareSplitMessageForWrite();\n"
        "}\n");
  }

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b) &&
               IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
               ShouldSplit(a, options_) == ShouldSplit(b, options_);
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check =
        MaybeEmitHaswordsCheck(it, next, options_, has_bit_indices_,
                               cached_has_word_index, "from.", p);

    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      const bool cache_has_bits = HasByteIndex(fields.front()) != kNoHasbit;
      const bool check_has_byte = cache_has_bits && fields.size() > 1 &&
                                  !IsLikelyPresent(fields.back(), options_);

      DebugAssertUniformLikelyPresence(fields, options_);

      if (cache_has_bits &&
          cached_has_word_index != HasWordIndex(fields.front())) {
        cached_has_word_index = HasWordIndex(fields.front());
        format("cached_has_bits = from.$has_bits$[$1$];\n",
               cached_has_word_index);
      }

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForGroup(
                                   chunk_mask, fields, options_));
        format.Indent();
      }

      // Go back and emit merging code for each of the fields we processed.
      for (const auto* field : fields) {
        const auto& generator = field_generators_.get(field);

        if (field->is_repeated()) {
          generator.GenerateMergingCode(p);
        } else if (!field->is_required() && !field->is_repeated() &&
                   !HasHasbit(field)) {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          MayEmitMutableIfNonDefaultCheck(
              p, "from.", field, ShouldSplit(field, options_), options_,
              /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
              /*with_enclosing_braces_always=*/true);
        } else if (field->options().weak() ||
                   cached_has_word_index != HasWordIndex(field)) {
          // Check hasbit, not using cached bits.
          auto v = p->WithVars(HasBitVars(field));
          format(
              "if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) "
              "{\n");
          format.Indent();
          generator.GenerateMergingCode(p);
          format.Outdent();
          format("}\n");
        } else {
          // Check hasbit, using cached bits.
          ABSL_CHECK(HasHasbit(field));
          int has_bit_index = has_bit_indices_[field->index()];
          format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForField(
                                     has_bit_index, field, options_));
          format.Indent();

          if (GetFieldHasbitMode(field) == HasbitMode::kHintHasbit) {
            // Merge semantics without true field presence: primitive fields are
            // merged only if non-zero (numeric) or non-empty (string).
            MayEmitMutableIfNonDefaultCheck(
                p, "from.", field, ShouldSplit(field, options_), options_,
                /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
                /*with_enclosing_braces_always=*/false);
          } else {
            ABSL_DCHECK(GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit);
            if (check_has_byte && IsPOD(field)) {
              generator.GenerateCopyConstructorCode(p);
            } else {
              generator.GenerateMergingCode(p);
            }
          }

          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  if (HasBitsSize() == 1) {
    // Optimization to avoid a load. Assuming that most messages have fewer than
    // 32 fields, this seems useful.
    p->Emit(R"cc(
      _this->$has_bits$[0] |= cached_has_bits;
    )cc");
  } else if (HasBitsSize() > 1) {
    p->Emit(R"cc(
      _this->$has_bits$.Or(from.$has_bits$);
    )cc");
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit({{"name", oneof->name()},
             {"NAME", absl::AsciiStrToUpper(oneof->name())},
             {"index", oneof->index()},
             {"cases",
              [&] {
                for (const auto* field : FieldRange(oneof)) {
                  p->Emit(
                      {{"Label", UnderscoresToCamelCase(field->name(), true)},
                       {"body",
                        [&] {
                          field_generators_.get(field).GenerateMergingCode(p);
                        }}},
                      R"cc(
                        case k$Label$: {
                          $body$;
                          break;
                        }
                      )cc");
                }
              }}},
            R"cc(
              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {
                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];
                const bool oneof_needs_init = oneof_to_case != oneof_from_case;
                if (oneof_needs_init) {
                  if (oneof_to_case != 0) {
                    _this->clear_$name$();
                  }
                  _this->$oneof_case$[$index$] = oneof_from_case;
                }

                switch (oneof_from_case) {
                  $cases$;
                  case $NAME$_NOT_SET:
                    break;
                }
              }
            )cc");
  }
  if (num_weak_fields_) {
    format(
        "_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);"
        "\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);
    )cc");
  }

  format(
      "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._"
      "internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}